

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

ps_alignment_iter_t * ps_alignment_iter_children(ps_alignment_iter_t *itor)

{
  ps_alignment_iter_t *itor2;
  ps_alignment_iter_t *itor_local;
  
  if (itor == (ps_alignment_iter_t *)0x0) {
    itor_local = (ps_alignment_iter_t *)0x0;
  }
  else if (itor->vec == &itor->al->state) {
    itor_local = (ps_alignment_iter_t *)0x0;
  }
  else if (itor->vec->seq[itor->pos].child == -1) {
    itor_local = (ps_alignment_iter_t *)0x0;
  }
  else {
    itor_local = (ps_alignment_iter_t *)
                 __ckd_calloc__(1,0x20,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                                ,0x1f9);
    itor_local->al = itor->al;
    itor_local->pos = itor->vec->seq[itor->pos].child;
    itor_local->parent = itor->pos;
    if (itor->vec == &itor->al->word) {
      itor_local->vec = &itor->al->sseq;
    }
    else {
      itor_local->vec = &itor->al->state;
    }
  }
  return itor_local;
}

Assistant:

ps_alignment_iter_t *
ps_alignment_iter_children(ps_alignment_iter_t *itor)
{
    ps_alignment_iter_t *itor2;
    if (itor == NULL)
        return NULL;
    if (itor->vec == &itor->al->state)
        return NULL;
    if (itor->vec->seq[itor->pos].child == PS_ALIGNMENT_NONE)
        return NULL;
    itor2 = ckd_calloc(1, sizeof(*itor2));
    itor2->al = itor->al;
    itor2->pos = itor->vec->seq[itor->pos].child;
    /* Iterate over only parent's phones/states */
    itor2->parent = itor->pos;
    if (itor->vec == &itor->al->word)
        itor2->vec = &itor->al->sseq;
    else
        itor2->vec = &itor->al->state;
    return itor2;
}